

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

void __thiscall OpenSSLWrapper::SslConnection::SSLSetShutdown(SslConnection *this,int iState)

{
  std::mutex::lock(&this->m_mxSsl);
  SSL_set_shutdown((SSL *)this->m_ssl,iState);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxSsl);
  return;
}

Assistant:

void SslConnection::SSLSetShutdown(int iState)
    {
        lock_guard<mutex> lk(m_mxSsl);
        SSL_set_shutdown(m_ssl, iState);
    }